

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

bool __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::consume_operation::start_consume_impl
          (consume_operation *this,PrivateType param_1,
          conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *i_queue)

{
  bool bVar1;
  
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
          ::Consume::empty((Consume *)this);
  if (!bVar1) {
    LOCK();
    **(long **)(this + 8) = *(long *)(this + 0x10) + -2;
    UNLOCK();
    *(undefined8 *)(this + 0x10) = 0;
  }
  detail::
  LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  ::Consume::start_consume_impl
            ((Consume *)this,
             (LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
              *)i_queue);
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
          ::Consume::empty((Consume *)this);
  return !bVar1;
}

Assistant:

bool start_consume_impl(PrivateType, lf_heter_queue * i_queue)
            {
                if (!m_consume_data.empty())
                {
                    m_consume_data.cancel_consume_impl();
                }

                m_consume_data.start_consume_impl(i_queue);

                return !m_consume_data.empty();
            }